

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O2

void __thiscall
Group::Group(Group *this,string *groupNumber,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *data,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>_>
                  *preps_map)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  long lVar3;
  ulong i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  raw_data;
  allocator local_1a1;
  vector<Day,_std::allocator<Day>_> *local_1a0;
  Group *local_198;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_190;
  vector<Lesson,_std::allocator<Lesson>_> *local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_180;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_178;
  string local_170;
  string local_150;
  string local_130;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_110;
  Lesson local_d8;
  
  local_180 = data;
  local_178 = &preps_map->_M_h;
  std::__cxx11::string::string((string *)this,(string *)groupNumber);
  local_1a0 = &this->days;
  (this->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_188 = &this->lesson_map;
  (this->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->lesson_set;
  p_Var1 = &(this->lesson_set)._M_t._M_impl.super__Rb_tree_header;
  (this->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->days).super__Vector_base<Day,_std::allocator<Day>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lesson_set)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar3 = 0;
  local_198 = this;
  for (i = 0; pbVar2 = (local_180->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
      i < (ulong)((long)(local_180->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5); i = i + 1)
  {
    std::__cxx11::string::string
              ((string *)&local_170,(string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar3));
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(&local_110,local_178);
    Lesson::Lesson(&local_d8,i,&local_170,
                   (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>_>
                    *)&local_110);
    std::vector<Lesson,_std::allocator<Lesson>_>::emplace_back<Lesson>(local_188,&local_d8);
    Lesson::~Lesson(&local_d8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_110);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::string
              ((string *)&local_130,
               (string *)
               ((long)&(((local_180->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3));
    std::__cxx11::string::string((string *)&local_150,"#",&local_1a1);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_d8,&local_130,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              (local_190,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_d8.lesson_id);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8);
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

Group(std::string groupNumber, std::vector<std::string> data, std::unordered_map <std::string, Professor> preps_map) :
            groupNumber(groupNumber)
    {
        for(size_t i = 0; i < data.size(); i++) {

            //size_t key = i;

            lesson_map.push_back(Lesson(i, data[i],preps_map));
//            Lesson new1 = Lesson(i, data[i],preps_map);
//            new1.print();

            //Lesson one_lesson(i, data[i],preps_map);
            std::vector <std::string> raw_data = split(data[i], "#");
            lesson_set.insert(raw_data[0]);
//            std::vector<std::string>::const_iterator first = data.begin() + i ;
//            std::vector<std::string>::const_iterator last = data.begin() + i + 7;
//            std::vector<std::string> newVec(first, last);
//
//            Day one_day(i/7, newVec, preps_map);
//            days.push_back(one_day);
        }
    }